

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token_iterator.h
# Opt level: O2

void __thiscall string_token_iterator::find_next(string_token_iterator *this)

{
  size_type sVar1;
  
  sVar1 = std::__cxx11::string::find_first_not_of((char *)this->str,(ulong)this->separator);
  this->start = sVar1;
  if (sVar1 == 0xffffffffffffffff) {
    this->str = (string *)0x0;
    this->start = 0;
    sVar1 = 0;
  }
  else {
    sVar1 = std::__cxx11::string::find_first_of((char *)this->str,(ulong)this->separator);
  }
  this->end = sVar1;
  return;
}

Assistant:

void find_next(void)
  {
    start = str->find_first_not_of(separator, end);
    if(start == std::string::npos)
    {
      start = end = 0;
      str = 0;
      return;
    }

    end = str->find_first_of(separator, start);
  }